

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_waypoint_node.cpp
# Opt level: O2

void __thiscall random_waypoint_node::run(random_waypoint_node *this)

{
  vec3 *pvVar1;
  int iVar2;
  vec3 *pvVar3;
  long lVar4;
  long lVar5;
  result_type rVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uniform_real_distribution<double> randomY;
  uniform_real_distribution<double> randomX;
  uniform_real_distribution<double> randomVel;
  uniform_real_distribution<double> randomZ;
  uniform_real_distribution<double> local_70;
  uniform_real_distribution<double> local_60;
  uniform_real_distribution<double> local_50;
  uniform_real_distribution<double> local_40;
  
  local_60._M_param._M_a = XMIN;
  local_60._M_param._M_b = XMAX;
  local_70._M_param._M_a = YMIN;
  local_70._M_param._M_b = YMAX;
  local_40._M_param._M_a = ZMIN;
  local_40._M_param._M_b = ZMAX;
  local_50._M_param._M_a = VMIN;
  local_50._M_param._M_b = VMAX;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_60,&e);
  (this->super_node).x = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_70,&e);
  (this->super_node).y = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_40,&e);
  (this->super_node).z = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_60,&e);
  this->destx = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_70,&e);
  this->desty = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_40,&e);
  this->destz = rVar6;
  rVar6 = std::uniform_real_distribution<double>::operator()(&local_50,&e);
  (this->super_node).v = rVar6;
  dVar7 = atan2(this->desty - (this->super_node).y,this->destx - (this->super_node).x);
  (this->super_node).d = dVar7;
  dVar7 = this->destz - (this->super_node).z;
  dVar9 = this->desty - (this->super_node).y;
  dVar8 = this->destx - (this->super_node).x;
  dVar7 = acos(dVar7 / SQRT(dVar7 * dVar7 + dVar9 * dVar9 + dVar8 * dVar8));
  (this->super_node).p = dVar7;
  *(uint *)(usleep + *(long *)(std::cout + -0x18)) =
       *(uint *)(usleep + *(long *)(std::cout + -0x18)) | 4;
  std::chrono::_V2::system_clock::now();
  lVar4 = std::chrono::_V2::system_clock::now();
  std::chrono::_V2::system_clock::now();
  pvVar3 = points;
  dVar7 = (this->super_node).z;
  iVar2 = (this->super_node).id;
  dVar8 = (this->super_node).y;
  pvVar1 = points + iVar2;
  pvVar1->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)(this->super_node).x;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar8;
  pvVar3[iVar2].field_2.z = (float)dVar7;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  while (running == true) {
    std::chrono::_V2::system_clock::now();
    lVar5 = std::chrono::_V2::system_clock::now();
    if ((this->super_node).first == true) {
      (this->super_node).first = false;
      lVar4 = lVar5;
    }
    update(this,((double)(lVar5 - lVar4) / 1000.0) / 1000000.0);
    lVar4 = std::chrono::_V2::system_clock::now();
    std::chrono::_V2::system_clock::now();
    if ((this->super_node).lastErr == 1) {
      rVar6 = std::uniform_real_distribution<double>::operator()(&local_60,&e);
      this->destx = rVar6;
      rVar6 = std::uniform_real_distribution<double>::operator()(&local_70,&e);
      this->desty = rVar6;
      rVar6 = std::uniform_real_distribution<double>::operator()(&local_40,&e);
      this->destz = rVar6;
      rVar6 = std::uniform_real_distribution<double>::operator()(&local_50,&e);
      node::setv(&this->super_node,rVar6);
      dVar7 = atan2(this->desty - (this->super_node).y,this->destx - (this->super_node).x);
      node::setd(&this->super_node,dVar7);
      dVar7 = this->destz - (this->super_node).z;
      dVar9 = this->desty - (this->super_node).y;
      dVar8 = this->destx - (this->super_node).x;
      dVar7 = acos(dVar7 / SQRT(dVar7 * dVar7 + dVar9 * dVar9 + dVar8 * dVar8));
      node::setp(&this->super_node,dVar7);
      (this->super_node).lastErr = 0;
    }
    usleep(1000);
  }
  return;
}

Assistant:

void random_waypoint_node::run(){
    uniform_real_distribution<double> randomX(XMIN,XMAX);
    uniform_real_distribution<double> randomY(YMIN,YMAX);
    uniform_real_distribution<double> randomZ(ZMIN,ZMAX);
    uniform_real_distribution<double> randomVel(VMIN,VMAX);
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    x = randomX(e);
    y = randomY(e);
    z = randomZ(e);
    destx = randomX(e);
    desty = randomY(e);
    destz = randomZ(e);
    v = randomVel(e);
    d = atan2(desty-y,destx-x);
    p = acos((destz-z)/(sqrt((desty-y)*(desty-y)+(destx-x)*(destx-x)+(destz -z)*(destz -z))));
    std::chrono::duration<double, std::micro> tmpTime;     //Time between current and lastshow
    std::chrono::duration<double, std::micro> loopTime;    //Time used for a single loop
    std::chrono::duration<double, std::micro> changeTime;
    std::chrono::duration<double, std::micro> wholeTime;
    high_resolution_clock::time_point loopEndTime;
    cout<<setiosflags(ios::fixed);
    high_resolution_clock::time_point baseTime = high_resolution_clock::now();
    high_resolution_clock::time_point lastChange = high_resolution_clock::now();    //Time when random_waypoint_node info changed
    high_resolution_clock::time_point  lastUpdate = lastChange;   //Time when random_waypoint_node loc updated
    high_resolution_clock::time_point lastShow = lastUpdate;    //Time when random_waypoint_node info shown
    high_resolution_clock::time_point currentTime = high_resolution_clock::now();
    wholeTime = currentTime-baseTime;
//    printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
    //initial output
    while(running == true){
        currentTime = high_resolution_clock::now();
        tmpTime = (currentTime-lastShow);
        loopEndTime = high_resolution_clock::now();
        if (first) {
            lastUpdate = loopEndTime;
            lastChange = loopEndTime;
            first = false;
        }
        loopTime=(loopEndTime-lastUpdate);
        this->update(loopTime.count()/1e6);
        lastUpdate = high_resolution_clock::now();
        currentTime = high_resolution_clock::now();
        changeTime = currentTime-lastChange;
        if(lastErr == 1){       //Regenerate random_waypoint_node info every $timeout second
            lastChange = currentTime;
            destx = randomX(e);
            desty = randomY(e);
            destz = randomZ(e);
            this->setv(randomVel(e));
            this->setd(atan2(desty-y,destx-x));
            this->setp(acos((destz-z)/(sqrt((desty-y)*(desty-y)+(destx-x)*(destx-x)+(destz -z)*(destz -z)))));
            lastErr = 0;                //To avoid random_waypoint_node bouncing near the edge
        }
        usleep(1000);
    }
}